

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

int VP8BitWriterInit(VP8BitWriter *bw,size_t expected_size)

{
  ulong uVar1;
  uint8_t *__dest;
  int iVar2;
  ulong uVar3;
  size_t size;
  
  bw->range = 0xfe;
  bw->value = 0;
  bw->run = 0;
  bw->nb_bits = -8;
  bw->buf = (uint8_t *)0x0;
  bw->pos = 0;
  *(undefined8 *)((long)&bw->pos + 4) = 0;
  *(undefined8 *)((long)&bw->max_pos + 4) = 0;
  if (expected_size == 0) {
    return 1;
  }
  uVar3 = expected_size + bw->pos;
  iVar2 = 1;
  if (bw->max_pos < uVar3) {
    uVar1 = bw->max_pos * 2;
    if (uVar1 <= uVar3) {
      uVar1 = uVar3;
    }
    size = 0x400;
    if (0x400 < uVar1) {
      size = uVar1;
    }
    __dest = (uint8_t *)WebPSafeMalloc(1,size);
    if (__dest == (uint8_t *)0x0) {
      bw->error = 1;
      iVar2 = 0;
    }
    else {
      if (bw->pos != 0) {
        memcpy(__dest,bw->buf,bw->pos);
      }
      WebPSafeFree(bw->buf);
      bw->buf = __dest;
      bw->max_pos = size;
    }
  }
  return iVar2;
}

Assistant:

int VP8BitWriterInit(VP8BitWriter* const bw, size_t expected_size) {
  bw->range   = 255 - 1;
  bw->value   = 0;
  bw->run     = 0;
  bw->nb_bits = -8;
  bw->pos     = 0;
  bw->max_pos = 0;
  bw->error   = 0;
  bw->buf     = NULL;
  return (expected_size > 0) ? BitWriterResize(bw, expected_size) : 1;
}